

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O2

int nni_plat_file_get(char *name,void **datap,size_t *lenp)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  void *__ptr;
  size_t sVar3;
  undefined1 local_c0 [8];
  stat st;
  
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
    return iVar1;
  }
  iVar1 = stat(name,(stat *)local_c0);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
    fclose(__stream);
    return iVar1;
  }
  if (st.st_rdev == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = nni_alloc(st.st_rdev);
    if (__ptr == (void *)0x0) {
      iVar1 = 2;
      goto LAB_00137a2f;
    }
    sVar3 = fread(__ptr,1,st.st_rdev,__stream);
    if (sVar3 != st.st_rdev) {
      piVar2 = __errno_location();
      iVar1 = nni_plat_errno(*piVar2);
      nni_free(__ptr,st.st_rdev);
      goto LAB_00137a2f;
    }
  }
  *datap = __ptr;
  *lenp = st.st_rdev;
  iVar1 = 0;
LAB_00137a2f:
  fclose(__stream);
  return iVar1;
}

Assistant:

int
nni_plat_file_get(const char *name, void **datap, size_t *lenp)
{
	FILE *      f;
	struct stat st;
	int         rv = 0;
	size_t      len;
	void *      data;

	if ((f = fopen(name, "rb")) == NULL) {
		return (nni_plat_errno(errno));
	}

	if (stat(name, &st) != 0) {
		rv = nni_plat_errno(errno);
		(void) fclose(f);
		return (rv);
	}

	len = st.st_size;
	if (len > 0) {
		if ((data = nni_alloc(len)) == NULL) {
			rv = NNG_ENOMEM;
			goto done;
		}
		if (fread(data, 1, len, f) != len) {
			rv = nni_plat_errno(errno);
			nni_free(data, len);
			goto done;
		}
	} else {
		data = NULL;
	}
	*datap = data;
	*lenp  = len;
done:
	(void) fclose(f);
	return (rv);
}